

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O3

void __thiscall
wabt::interp::RefPtr<wabt::interp::Table>::RefPtr
          (RefPtr<wabt::interp::Table> *this,Store *store,Ref ref)

{
  ObjectKind OVar1;
  Object *pOVar2;
  Table *pTVar3;
  Index IVar4;
  Memory *this_00;
  Ref ref_00;
  RefPtr<wabt::interp::Memory> *pRVar5;
  Store *extraout_RDX;
  RefPtr<wabt::interp::Memory> *this_01;
  Memory *pMStack_78;
  undefined1 auStack_70 [40];
  size_t sStack_48;
  
  pOVar2 = (store->objects_).list_.
           super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>.
           _M_impl.super__Vector_impl_data._M_start[ref.index];
  if (((ulong)pOVar2 & 1) == 0) {
    OVar1 = pOVar2->kind_;
    if (OVar1 != Table) {
      pRVar5 = (RefPtr<wabt::interp::Memory> *)0x0;
      this_01 = (RefPtr<wabt::interp::Memory> *)(ulong)OVar1;
      if (ref.index == 0) {
        this_01 = pRVar5;
      }
      interp::RefPtr((interp *)this_01);
      sStack_48 = ref.index;
      this_00 = (Memory *)operator_new(0x88);
      auStack_70._8_4_ = *(undefined4 *)&pRVar5->store_;
      auStack_70._0_8_ = &PTR__ExternType_001cf2d0;
      auStack_70._32_8_ = pRVar5[1].store_;
      auStack_70._16_8_ = pRVar5->root_index_;
      auStack_70._24_8_ = pRVar5[1].obj_;
      Memory::Memory(this_00,extraout_RDX,(MemoryType *)auStack_70);
      pMStack_78 = this_00;
      ref_00.index = FreeList<wabt::interp::Object*>::New<wabt::interp::Memory*>
                               ((FreeList<wabt::interp::Object*> *)&store->objects_,&pMStack_78);
      RefPtr<wabt::interp::Memory>::RefPtr(this_01,store,ref_00);
      (this_01->obj_->super_Extern).super_Object.self_.index = ref_00.index;
      return;
    }
    IVar4 = Store::NewRoot(store,ref);
    this->root_index_ = IVar4;
    pTVar3 = (Table *)(store->objects_).list_.
                      super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[ref.index];
    if (((ulong)pTVar3 & 1) == 0) {
      this->obj_ = pTVar3;
      this->store_ = store;
      return;
    }
  }
  else if (ref.index == 0) {
    interp::RefPtr((interp *)0x0);
  }
  __assert_fail("IsUsed(index)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/interp/interp-inl.h"
                ,0xe5,
                "T &wabt::interp::FreeList<wabt::interp::Object *>::Get(Index) [T = wabt::interp::Object *]"
               );
}

Assistant:

RefPtr<T>::RefPtr(Store& store, Ref ref) {
#ifndef NDEBUG
  if (!store.Is<T>(ref)) {
    ObjectKind ref_kind;
    if (ref == Ref::Null) {
      ref_kind = ObjectKind::Null;
    } else {
      ref_kind = store.objects_.Get(ref.index)->kind();
    }
    fprintf(stderr, "Invalid conversion from Ref (%s) to RefPtr<%s>!\n",
            GetName(ref_kind), T::GetTypeName());
    abort();
  }
#endif
  root_index_ = store.NewRoot(ref);
  obj_ = static_cast<T*>(store.objects_.Get(ref.index));
  store_ = &store;
}